

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shader.cpp
# Opt level: O0

void gl_ParseHardwareShader(FScanner *sc,int deflump)

{
  bool bVar1;
  FTextureID texnum;
  uint uVar2;
  int iVar3;
  FTexture *pFVar4;
  char *pcVar5;
  FString *this;
  uint local_54;
  uint i;
  FTexture *tex;
  FTextureID no;
  float local_2c;
  float speed;
  FString maplumpname;
  int maplump;
  bool iwad;
  bool thiswad;
  bool disable_fullbright;
  int type;
  int deflump_local;
  FScanner *sc_local;
  
  maplump = 0;
  maplumpname.Chars._7_1_ = 0;
  maplumpname.Chars._6_1_ = 0;
  maplumpname.Chars._5_1_ = 0;
  maplumpname.Chars._0_4_ = 0xffffffff;
  FString::FString((FString *)&stack0xffffffffffffffd8);
  local_2c = 1.0;
  FScanner::MustGetString(sc);
  bVar1 = FScanner::Compare(sc,"texture");
  if (bVar1) {
    maplump = 1;
  }
  else {
    bVar1 = FScanner::Compare(sc,"flat");
    if (bVar1) {
      maplump = 2;
    }
    else {
      bVar1 = FScanner::Compare(sc,"sprite");
      if (bVar1) {
        maplump = 3;
      }
      else {
        FScanner::UnGet(sc);
      }
    }
  }
  FScanner::MustGetString(sc);
  texnum = FTextureManager::CheckForTexture(&TexMan,sc->String,maplump,1);
  pFVar4 = FTextureManager::operator[](&TexMan,texnum);
  FScanner::MustGetToken(sc,0x7b);
  while (bVar1 = FScanner::CheckToken(sc,0x7d), ((bVar1 ^ 0xffU) & 1) != 0) {
    FScanner::MustGetString(sc);
    bVar1 = FScanner::Compare(sc,"shader");
    if (bVar1) {
      FScanner::MustGetString(sc);
      FString::operator=((FString *)&stack0xffffffffffffffd8,sc->String);
    }
    else {
      bVar1 = FScanner::Compare(sc,"speed");
      if (bVar1) {
        FScanner::MustGetFloat(sc);
        local_2c = (float)sc->Float;
      }
    }
  }
  if ((pFVar4 != (FTexture *)0x0) &&
     (bVar1 = FString::IsNotEmpty((FString *)&stack0xffffffffffffffd8), bVar1)) {
    if ((*(ushort *)&pFVar4->field_0x31 >> 6 & 3) == 0) {
      (pFVar4->gl_info).shaderspeed = local_2c;
      for (local_54 = 0; uVar2 = TArray<FString,_FString>::Size(&usershaders), local_54 < uVar2;
          local_54 = local_54 + 1) {
        this = TArray<FString,_FString>::operator[](&usershaders,(ulong)local_54);
        iVar3 = FString::CompareNoCase(this,(FString *)&stack0xffffffffffffffd8);
        if (iVar3 == 0) {
          (pFVar4->gl_info).shaderindex = local_54 + 0xc;
          goto LAB_00538338;
        }
      }
      uVar2 = TArray<FString,_FString>::Push(&usershaders,(FString *)&stack0xffffffffffffffd8);
      (pFVar4->gl_info).shaderindex = uVar2 + 0xc;
    }
    else {
      pcVar5 = FString::GetChars(&pFVar4->Name);
      Printf("Cannot combine warping with hardware shader on texture \'%s\'\n",pcVar5);
    }
  }
LAB_00538338:
  FString::~FString((FString *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void gl_ParseHardwareShader(FScanner &sc, int deflump)
{
	int type = FTexture::TEX_Any;
	bool disable_fullbright=false;
	bool thiswad = false;
	bool iwad = false;
	int maplump = -1;
	FString maplumpname;
	float speed = 1.f;

	sc.MustGetString();
	if (sc.Compare("texture")) type = FTexture::TEX_Wall;
	else if (sc.Compare("flat")) type = FTexture::TEX_Flat;
	else if (sc.Compare("sprite")) type = FTexture::TEX_Sprite;
	else sc.UnGet();

	sc.MustGetString();
	FTextureID no = TexMan.CheckForTexture(sc.String, type);
	FTexture *tex = TexMan[no];

	sc.MustGetToken('{');
	while (!sc.CheckToken('}'))
	{
		sc.MustGetString();
		if (sc.Compare("shader"))
		{
			sc.MustGetString();
			maplumpname = sc.String;
		}
		else if (sc.Compare("speed"))
		{
			sc.MustGetFloat();
			speed = float(sc.Float);
		}
	}
	if (!tex)
	{
		return;
	}

	if (maplumpname.IsNotEmpty())
	{
		if (tex->bWarped != 0)
		{
			Printf("Cannot combine warping with hardware shader on texture '%s'\n", tex->Name.GetChars());
			return;
		}
		tex->gl_info.shaderspeed = speed; 
		for(unsigned i=0;i<usershaders.Size();i++)
		{
			if (!usershaders[i].CompareNoCase(maplumpname))
			{
				tex->gl_info.shaderindex = i + FIRST_USER_SHADER;
				return;
			}
		}
		tex->gl_info.shaderindex = usershaders.Push(maplumpname) + FIRST_USER_SHADER;
	}	
}